

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FieldDescriptor * __thiscall
google::protobuf::DescriptorPool::FindExtensionByPrintableName
          (DescriptorPool *this,Descriptor *extendee,ConstStringParam printable_name)

{
  int iVar1;
  long lVar2;
  once_flag *__once;
  FieldDescriptor *pFVar3;
  Descriptor *pDVar4;
  Descriptor *pDVar5;
  long lVar6;
  FieldDescriptor *local_40;
  _func_void_FieldDescriptor_ptr *local_38;
  
  if (*(int *)(extendee + 0x78) != 0) {
    pFVar3 = FindExtensionByName(this,printable_name);
    if ((pFVar3 != (FieldDescriptor *)0x0) && (*(Descriptor **)(pFVar3 + 0x20) == extendee)) {
      return pFVar3;
    }
    if (((*(char *)(*(long *)(extendee + 0x20) + 0x48) == '\x01') &&
        (pDVar4 = FindMessageTypeByName(this,printable_name), pDVar4 != (Descriptor *)0x0)) &&
       (iVar1 = *(int *)(pDVar4 + 0x7c), 0 < (long)iVar1)) {
      lVar6 = 0;
      do {
        lVar2 = *(long *)(pDVar4 + 0x50);
        if (*(Descriptor **)(lVar2 + 0x20 + lVar6) == extendee) {
          pFVar3 = (FieldDescriptor *)(lVar6 + lVar2);
          __once = *(once_flag **)(lVar2 + 0x18 + lVar6);
          if (__once != (once_flag *)0x0) {
            local_38 = FieldDescriptor::TypeOnceInit;
            local_40 = pFVar3;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (__once,&local_38,&local_40);
          }
          if (((*(char *)(lVar2 + 2 + lVar6) == '\v') &&
              ((*(byte *)(lVar2 + 1 + lVar6) & 0x60) == 0x20)) &&
             (pDVar5 = FieldDescriptor::message_type(pFVar3), pDVar5 == pDVar4)) {
            return pFVar3;
          }
        }
        lVar6 = lVar6 + 0x48;
      } while ((long)iVar1 * 0x48 != lVar6);
    }
  }
  return (FieldDescriptor *)0x0;
}

Assistant:

const FieldDescriptor* DescriptorPool::FindExtensionByPrintableName(
    const Descriptor* extendee, ConstStringParam printable_name) const {
  if (extendee->extension_range_count() == 0) return nullptr;
  const FieldDescriptor* result = FindExtensionByName(printable_name);
  if (result != nullptr && result->containing_type() == extendee) {
    return result;
  }
  if (extendee->options().message_set_wire_format()) {
    // MessageSet extensions may be identified by type name.
    const Descriptor* type = FindMessageTypeByName(printable_name);
    if (type != nullptr) {
      // Look for a matching extension in the foreign type's scope.
      const int type_extension_count = type->extension_count();
      for (int i = 0; i < type_extension_count; i++) {
        const FieldDescriptor* extension = type->extension(i);
        if (extension->containing_type() == extendee &&
            extension->type() == FieldDescriptor::TYPE_MESSAGE &&
            extension->is_optional() && extension->message_type() == type) {
          // Found it.
          return extension;
        }
      }
    }
  }
  return nullptr;
}